

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# VertexBuffer.cpp
# Opt level: O0

bool __thiscall sf::VertexBuffer::create(VertexBuffer *this,size_t vertexCount)

{
  bool bVar1;
  GLenum GVar2;
  ostream *poVar3;
  long in_RSI;
  long in_RDI;
  TransientContextLock contextLock;
  TransientContextLock *in_stack_ffffffffffffffa0;
  undefined4 in_stack_ffffffffffffffb0;
  undefined4 in_stack_ffffffffffffffb4;
  bool local_1;
  
  bVar1 = isAvailable();
  if (bVar1) {
    GlResource::TransientContextLock::TransientContextLock
              ((TransientContextLock *)CONCAT44(in_stack_ffffffffffffffb4,in_stack_ffffffffffffffb0)
              );
    if (*(int *)(in_RDI + 8) == 0) {
      (*sf_glad_glGenBuffersARB)(1,(GLuint *)(in_RDI + 8));
    }
    local_1 = *(int *)(in_RDI + 8) != 0;
    if (local_1) {
      (*sf_glad_glBindBufferARB)(0x8892,*(GLuint *)(in_RDI + 8));
      in_stack_ffffffffffffffa0 = (TransientContextLock *)sf_glad_glBufferDataARB;
      GVar2 = anon_unknown.dwarf_3d7f43::VertexBufferImpl::usageToGlEnum(*(Usage *)(in_RDI + 0x1c));
      (*(code *)in_stack_ffffffffffffffa0)(0x8892,in_RSI * 0x14,0,GVar2);
      (*sf_glad_glBindBufferARB)(0x8892,0);
      *(long *)(in_RDI + 0x10) = in_RSI;
    }
    else {
      poVar3 = err();
      poVar3 = std::operator<<(poVar3,"Could not create vertex buffer, generation failed");
      std::ostream::operator<<(poVar3,std::endl<char,std::char_traits<char>>);
    }
    GlResource::TransientContextLock::~TransientContextLock(in_stack_ffffffffffffffa0);
  }
  else {
    local_1 = false;
  }
  return local_1;
}

Assistant:

bool VertexBuffer::create(std::size_t vertexCount)
{
    if (!isAvailable())
        return false;

    TransientContextLock contextLock;

    if (!m_buffer)
        glCheck(GLEXT_glGenBuffers(1, &m_buffer));

    if (!m_buffer)
    {
        err() << "Could not create vertex buffer, generation failed" << std::endl;
        return false;
    }

    glCheck(GLEXT_glBindBuffer(GLEXT_GL_ARRAY_BUFFER, m_buffer));
    glCheck(GLEXT_glBufferData(GLEXT_GL_ARRAY_BUFFER, static_cast<GLsizeiptrARB>(sizeof(Vertex) * vertexCount), 0, VertexBufferImpl::usageToGlEnum(m_usage)));
    glCheck(GLEXT_glBindBuffer(GLEXT_GL_ARRAY_BUFFER, 0));

    m_size = vertexCount;

    return true;
}